

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O3

void __thiscall
caffe::BlobShape::SerializeWithCachedSizes(BlobShape *this,CodedOutputStream *output)

{
  byte *pbVar1;
  void *pvVar2;
  bool bVar3;
  int iVar4;
  ulong *puVar5;
  int iVar6;
  byte *pbVar7;
  uint uVar8;
  ulong value;
  ulong uVar9;
  int index;
  uint value_00;
  
  if (0 < (this->dim_).current_size_) {
    if (output->buffer_size_ < 5) {
      google::protobuf::io::CodedOutputStream::WriteVarint32SlowPath(output,10);
      iVar4 = output->buffer_size_;
    }
    else {
      *output->buffer_ = '\n';
      output->buffer_ = output->buffer_ + 1;
      iVar4 = output->buffer_size_ + -1;
      output->buffer_size_ = iVar4;
    }
    value_00 = this->_dim_cached_byte_size_;
    if (iVar4 < 5) {
      google::protobuf::io::CodedOutputStream::WriteVarint32SlowPath(output,value_00);
    }
    else {
      pbVar1 = output->buffer_;
      pbVar7 = pbVar1;
      uVar8 = value_00;
      if (0x7f < value_00) {
        do {
          *pbVar7 = (byte)value_00 | 0x80;
          uVar8 = value_00 >> 7;
          pbVar7 = pbVar7 + 1;
          bVar3 = 0x3fff < value_00;
          value_00 = uVar8;
        } while (bVar3);
      }
      *pbVar7 = (byte)uVar8;
      iVar4 = ((int)pbVar7 - (int)pbVar1) + 1;
      output->buffer_ = output->buffer_ + iVar4;
      output->buffer_size_ = output->buffer_size_ - iVar4;
    }
    iVar4 = (this->dim_).current_size_;
    if (0 < iVar4) {
      index = 0;
      do {
        puVar5 = (ulong *)google::protobuf::RepeatedField<long>::Get(&this->dim_,index);
        value = *puVar5;
        if (output->buffer_size_ < 10) {
          google::protobuf::io::CodedOutputStream::WriteVarint64SlowPath(output,value);
        }
        else {
          pbVar1 = output->buffer_;
          pbVar7 = pbVar1;
          uVar9 = value;
          if (0x7f < value) {
            do {
              *pbVar7 = (byte)value | 0x80;
              uVar9 = value >> 7;
              pbVar7 = pbVar7 + 1;
              bVar3 = 0x3fff < value;
              value = uVar9;
            } while (bVar3);
          }
          *pbVar7 = (byte)uVar9;
          iVar6 = ((int)pbVar7 - (int)pbVar1) + 1;
          output->buffer_ = output->buffer_ + iVar6;
          output->buffer_size_ = output->buffer_size_ - iVar6;
        }
        index = index + 1;
      } while (index != iVar4);
    }
  }
  pvVar2 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    google::protobuf::internal::WireFormat::SerializeUnknownFields
              ((UnknownFieldSet *)((ulong)pvVar2 & 0xfffffffffffffffe),output);
    return;
  }
  return;
}

Assistant:

void BlobShape::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:caffe.BlobShape)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated int64 dim = 1 [packed = true];
  if (this->dim_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(1, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_dim_cached_byte_size_);
  }
  for (int i = 0, n = this->dim_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteInt64NoTag(
      this->dim(i), output);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    ::google::protobuf::internal::WireFormat::SerializeUnknownFields(
        unknown_fields(), output);
  }
  // @@protoc_insertion_point(serialize_end:caffe.BlobShape)
}